

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

long __thiscall tetgenmesh::improvequalitybysmoothing(tetgenmesh *this,optparameters *opm)

{
  triface *cosmaxd;
  triface *searchtet;
  uint *puVar1;
  arraypool *this_00;
  char *pcVar2;
  long lVar3;
  char **ppcVar4;
  byte bVar5;
  int iVar6;
  arraypool *paVar7;
  char *pcVar8;
  byte bVar9;
  long lVar10;
  long lVar11;
  undefined8 uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  tetrahedron *pppdVar17;
  long lVar18;
  bool bVar19;
  long local_90;
  
  paVar7 = (arraypool *)operator_new(0x30);
  paVar7->objectbytes = 0x88;
  paVar7->objectsperblock = 0x400;
  paVar7->log2objectsperblock = 10;
  paVar7->objectsperblockmark = 0x3ff;
  paVar7->toparraylen = 0;
  paVar7->toparray = (char **)0x0;
  paVar7->objects = 0;
  paVar7->totalmemory = 0;
  lVar18 = 0;
  bVar5 = 0;
  uVar12 = 0;
  do {
    this_00 = this->unflipqueue;
    this->unflipqueue = paVar7;
    if (this_00->objects < 1) goto LAB_0014d0ca;
    if ((this->b->verbose < 2) ||
       (printf("    Improving mesh quality by smoothing [%d]#:  %ld.\n",uVar12),
       0 < this_00->objects)) {
      lVar16 = 0;
      local_90 = 0;
      do {
        pcVar2 = this_00->toparray[(uint)lVar16 >> ((byte)this_00->log2objectsperblock & 0x1f)];
        lVar13 = (long)this_00->objectbytes *
                 (long)(int)(this_00->objectsperblockmark & (uint)lVar16);
        searchtet = (triface *)(pcVar2 + lVar13);
        iVar6 = gettetrahedron(this,*(point *)(pcVar2 + lVar13 + 0x58),
                               *(point *)(pcVar2 + lVar13 + 0x60),*(point *)(pcVar2 + lVar13 + 0x68)
                               ,*(point *)(pcVar2 + lVar13 + 0x70),searchtet);
        if ((iVar6 != 0) &&
           (pppdVar17 = searchtet->tet,
           (*(byte *)((long)pppdVar17 + (long)this->elemmarkerindex * 4) & 2) == 0)) {
          cosmaxd = searchtet + 2;
          tetalldihedral(this,(point)pppdVar17[4],(point)pppdVar17[5],(point)pppdVar17[6],
                         (point)pppdVar17[7],(double *)&searchtet[2].ver,(double *)cosmaxd,
                         (double *)0x0);
          if ((double)searchtet[2].tet < this->cossmtdihed) {
            pppdVar17 = pppdVar17 + 4;
            opm->initval = (double)searchtet[2].tet + 1.0;
            uVar14 = 0;
            do {
              uVar15 = uVar14;
              while ((*(uint *)((long)pppdVar17[uVar15] + (long)this->pointmarkindex * 4 + 4) &
                     0xffffff00) != 0x800) {
                bVar19 = 2 < uVar15;
                uVar15 = uVar15 + 1;
                if (bVar19) goto LAB_0014cf79;
              }
              getvertexstar(this,1,(point)pppdVar17[uVar15],this->cavetetlist,(arraypool *)0x0,
                            (arraypool *)0x0);
              opm->searchstep = 0.001;
              iVar6 = smoothpoint(this,(point)pppdVar17[uVar15],this->cavetetlist,1,opm);
              if (iVar6 == 0) {
                paVar7 = this->cavetetlist;
              }
              else {
                if (opm->smthiter == opm->maxiter) {
                  do {
                    opm->searchstep = opm->searchstep * 10.0;
                    opm->initval = opm->imprval;
                    opm->smthiter = 0;
                    smoothpoint(this,(point)pppdVar17[uVar15],this->cavetetlist,1,opm);
                  } while (opm->smthiter == opm->maxiter);
                }
                local_90 = local_90 + 1;
                paVar7 = this->cavetetlist;
                if ((opm->imprval + -1.0 < this->cossmtdihed) && (0 < paVar7->objects)) {
                  lVar13 = 0;
                  do {
                    pcVar2 = paVar7->toparray
                             [(uint)lVar13 >> ((byte)paVar7->log2objectsperblock & 0x1f)];
                    lVar10 = (long)paVar7->objectbytes *
                             (long)(int)(paVar7->objectsperblockmark & (uint)lVar13);
                    lVar3 = *(long *)(pcVar2 + lVar10);
                    if ((*(byte *)(lVar3 + (long)this->elemmarkerindex * 4) & 2) == 0) {
                      pppdVar17 = (tetrahedron *)(lVar3 + 0x20);
                      tetalldihedral(this,*(point *)(lVar3 + 0x20),*(point *)(lVar3 + 0x28),
                                     *(point *)(lVar3 + 0x30),*(point *)(lVar3 + 0x38),
                                     (double *)&searchtet[2].ver,(double *)cosmaxd,(double *)0x0);
                      if ((double)cosmaxd->tet <= this->cossmtdihed &&
                          this->cossmtdihed != (double)cosmaxd->tet) {
                        puVar1 = (uint *)(*(long *)(pcVar2 + lVar10) +
                                         (long)this->elemmarkerindex * 4);
                        *puVar1 = *puVar1 | 2;
                        paVar7 = this->unflipqueue;
                        pcVar8 = arraypool::getblock(paVar7,(int)paVar7->objects);
                        lVar11 = (long)paVar7->objectbytes *
                                 ((long)paVar7->objectsperblock - 1U & paVar7->objects);
                        paVar7->objects = paVar7->objects + 1;
                        *(undefined8 *)(pcVar8 + lVar11) = *(undefined8 *)(pcVar2 + lVar10);
                        *(undefined8 *)(pcVar8 + lVar11 + 0x58) = *(undefined8 *)(lVar3 + 0x20);
                        *(undefined8 *)(pcVar8 + lVar11 + 0x60) = *(undefined8 *)(lVar3 + 0x28);
                        *(undefined8 *)(pcVar8 + lVar11 + 0x68) = *(undefined8 *)(lVar3 + 0x30);
                        *(undefined8 *)(pcVar8 + lVar11 + 0x70) = *(undefined8 *)(lVar3 + 0x38);
                        pcVar2 = pcVar8 + lVar11 + 8;
                        pcVar2[0] = '\v';
                        pcVar2[1] = '\0';
                        pcVar2[2] = '\0';
                        pcVar2[3] = '\0';
                        pcVar8 = pcVar8 + lVar11 + 0x20;
                        pcVar8[0] = '\0';
                        pcVar8[1] = '\0';
                        pcVar8[2] = '\0';
                        pcVar8[3] = '\0';
                        pcVar8[4] = '\0';
                        pcVar8[5] = '\0';
                        pcVar8[6] = '\0';
                        pcVar8[7] = '\0';
                      }
                    }
                    lVar13 = lVar13 + 1;
                    paVar7 = this->cavetetlist;
                  } while (lVar13 < paVar7->objects);
                }
              }
              paVar7->objects = 0;
            } while ((iVar6 == 0) && (uVar14 = uVar15 + 1, uVar15 < 3));
            if (iVar6 == 0) {
LAB_0014cf79:
              puVar1 = (uint *)((long)searchtet->tet + (long)this->elemmarkerindex * 4);
              *puVar1 = *puVar1 | 2;
              paVar7 = this->unflipqueue;
              pcVar8 = arraypool::getblock(paVar7,(int)paVar7->objects);
              lVar13 = (long)paVar7->objectbytes *
                       ((long)paVar7->objectsperblock - 1U & paVar7->objects);
              paVar7->objects = paVar7->objects + 1;
              *(tetrahedron **)(pcVar8 + lVar13) = searchtet->tet;
              *(tetrahedron *)(pcVar8 + lVar13 + 0x58) = *pppdVar17;
              *(tetrahedron *)(pcVar8 + lVar13 + 0x60) = pppdVar17[1];
              *(tetrahedron *)(pcVar8 + lVar13 + 0x68) = pppdVar17[2];
              *(tetrahedron *)(pcVar8 + lVar13 + 0x70) = pppdVar17[3];
              pcVar2 = pcVar8 + lVar13 + 8;
              pcVar2[0] = '\v';
              pcVar2[1] = '\0';
              pcVar2[2] = '\0';
              pcVar2[3] = '\0';
              pcVar8 = pcVar8 + lVar13 + 0x20;
              pcVar8[0] = '\0';
              pcVar8[1] = '\0';
              pcVar8[2] = '\0';
              pcVar8[3] = '\0';
              pcVar8[4] = '\0';
              pcVar8[5] = '\0';
              pcVar8[6] = '\0';
              pcVar8[7] = '\0';
            }
          }
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < this_00->objects);
    }
    else {
      local_90 = 0;
    }
    this_00->objects = 0;
    paVar7 = this->unflipqueue;
    lVar16 = paVar7->objects;
    if (0 < lVar16) {
      ppcVar4 = paVar7->toparray;
      lVar13 = 0;
      do {
        puVar1 = (uint *)(*(long *)(ppcVar4[(uint)lVar13 >>
                                            ((byte)paVar7->log2objectsperblock & 0x1f)] +
                                   (long)paVar7->objectbytes *
                                   (long)(int)(paVar7->objectsperblockmark & (uint)lVar13)) +
                         (long)this->elemmarkerindex * 4);
        *puVar1 = *puVar1 & 0xfffffffd;
        lVar13 = lVar13 + 1;
      } while (lVar16 != lVar13);
    }
    if (1 < this->b->verbose) {
      printf("    Smooth %ld points.\n",local_90);
    }
    lVar18 = lVar18 + local_90;
    bVar9 = ~bVar5;
    uVar12 = 1;
    bVar5 = 1;
    paVar7 = this_00;
  } while ((bool)(bVar9 & local_90 != 0));
  if (this_00 != (arraypool *)0x0) {
LAB_0014d0ca:
    arraypool::~arraypool(this_00);
  }
  operator_delete(this_00,0x30);
  return lVar18;
}

Assistant:

long tetgenmesh::improvequalitybysmoothing(optparameters *opm)
{
  arraypool *flipqueue, *swapqueue;
  triface *parytet;
  badface *bface, *parybface;
  point *ppt;
  long totalsmtcount, smtcount;
  int smtflag;
  int iter, i, j, k;

  //assert(unflipqueue->objects > 0l);
  flipqueue = new arraypool(sizeof(badface), 10);

  // Swap the two flip queues.
  swapqueue = flipqueue;
  flipqueue = unflipqueue;
  unflipqueue = swapqueue;

  totalsmtcount = 0l;
  iter = 0;

  while (flipqueue->objects > 0l) {

    smtcount = 0l;

    if (b->verbose > 1) {
      printf("    Improving mesh quality by smoothing [%d]#:  %ld.\n",
             iter, flipqueue->objects);
    }

    for (k = 0; k < flipqueue->objects; k++) {      
      bface  = (badface *) fastlookup(flipqueue, k);
      if (gettetrahedron(bface->forg, bface->fdest, bface->fapex,
                         bface->foppo, &bface->tt)) {
        // Operate on it if it is not in 'unflipqueue'.
        if (!marktested(bface->tt)) {
          // Here we simply re-compute the quality. Since other smoothing
          //   operation may have moved the vertices of this tet.
          ppt = (point *) & (bface->tt.tet[4]);
          tetalldihedral(ppt[0], ppt[1], ppt[2], ppt[3], bface->cent, 
                         &bface->key, NULL);
          if (bface->key < cossmtdihed) { // if (maxdd < cosslidihed) {
            // It is a sliver. Try to smooth its vertices.
            smtflag = 0;
            opm->initval = bface->key + 1.0; 
            for (i = 0; (i < 4) && !smtflag; i++) {
              if (pointtype(ppt[i]) == FREEVOLVERTEX) {
                getvertexstar(1, ppt[i], cavetetlist, NULL, NULL);
                opm->searchstep = 0.001; // Search step size
                smtflag = smoothpoint(ppt[i], cavetetlist, 1, opm);
                if (smtflag) {
                  while (opm->smthiter == opm->maxiter) {
                    opm->searchstep *= 10.0; // Increase the step size.
                    opm->initval = opm->imprval;
                    opm->smthiter = 0; // reset
                    smoothpoint(ppt[i], cavetetlist, 1, opm);
                  }
                  // This tet is modifed.
                  smtcount++;
                  if ((opm->imprval - 1.0) < cossmtdihed) {
                    // There are slivers in new tets. Queue them.
                    for (j = 0; j < cavetetlist->objects; j++) {
                      parytet = (triface *) fastlookup(cavetetlist, j);
                      // Operate it if it is not in 'unflipqueue'.
                      if (!marktested(*parytet)) {
                        // Evaluate its quality.
                        // Re-use ppt, bface->key, bface->cent.
                        ppt = (point *) & (parytet->tet[4]);
                        tetalldihedral(ppt[0], ppt[1], ppt[2], ppt[3], 
                                       bface->cent, &bface->key, NULL);
                        if (bface->key < cossmtdihed) {
                          // A new sliver. Queue it.
                          marktest(*parytet); // It is in unflipqueue.
                          unflipqueue->newindex((void **) &parybface);
                          parybface->tt = *parytet;
                          parybface->forg = ppt[0];
                          parybface->fdest = ppt[1];
                          parybface->fapex = ppt[2];
                          parybface->foppo = ppt[3];
                          parybface->tt.ver = 11; 
                          parybface->key = 0.0;
                        }
                      }
                    } // j
                  } // if ((opm->imprval - 1.0) < cossmtdihed)
                } // if (smtflag)
                cavetetlist->restart();
              } // if (pointtype(ppt[i]) == FREEVOLVERTEX)
            } // i
            if (!smtflag) {
              // Didn't smooth. Queue it again.
              marktest(bface->tt); // It is in unflipqueue.
              unflipqueue->newindex((void **) &parybface);
              parybface->tt = bface->tt;
              parybface->forg = ppt[0];
              parybface->fdest = ppt[1];
              parybface->fapex = ppt[2];
              parybface->foppo = ppt[3];
              parybface->tt.ver = 11;
              parybface->key = 0.0;
            }
	      } // if (maxdd < cosslidihed)
        } // if (!marktested(...))
      } // if (gettetrahedron(...))
    } // k

    flipqueue->restart();

    // Unmark the tets in unflipqueue.
    for (i = 0; i < unflipqueue->objects; i++) {
      bface  = (badface *) fastlookup(unflipqueue, i);
      unmarktest(bface->tt);
    }

    if (b->verbose > 1) {
      printf("    Smooth %ld points.\n", smtcount);
    }
    totalsmtcount += smtcount;

    if (smtcount == 0l) {
      // No point has been smoothed. 
      break;
    } else {
      iter++;
      if (iter == 2) { //if (iter >= b->optpasses) {
        break;
      }
    }

    // Swap the two flip queues.
    swapqueue = flipqueue;
    flipqueue = unflipqueue;
    unflipqueue = swapqueue;
  } // while

  delete flipqueue;

  return totalsmtcount;
}